

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tr1_failurecount_assertion_tests.cpp
# Opt level: O3

void __thiscall
iu_FailureCountTest_x_iutest_x_Fail_Test::Body(iu_FailureCountTest_x_iutest_x_Fail_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestPartResultReporterInterface *pTVar2;
  TestFlag *pTVar3;
  Variable *pVVar4;
  int *in_R9;
  ScopedSPITestFlag guard;
  ScopedDisableTestFailureBreak statements_failure_count_testflag_guard;
  size_type __dnew;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult statemnets_ar;
  allocator<char> local_2c9;
  TestFlag local_2c8;
  TestFlag local_2c4;
  AssertionHelper local_2c0;
  AssertionResult local_290;
  SPIFailureChecker local_268;
  AssertionResult local_230;
  AssertionResult local_208;
  Collector<iutest::detail::NoTestPartResultReporter> local_1e0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [7];
  ios_base local_130 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_268.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0013e5d0;
  local_268.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2c8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_1e0);
  local_1e0.super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface = (TestPartResultReporterInterface)&PTR__Collector_0013e280;
  iutest::detail::ScopedDisableTestFailureBreak::ScopedDisableTestFailureBreak
            ((ScopedDisableTestFailureBreak *)&local_2c4);
  local_1b0._0_4_ = 0x2a;
  local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_290,(internal *)"f()","1",local_1b0,(int *)&local_2c0,in_R9);
  if (local_290.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,local_290.m_message._M_dataplus._M_p,&local_2c9);
    local_2c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
    ;
    local_2c0.m_part_result.super_iuCodeMessage.m_line = 0x26;
    local_2c0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2c0,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  paVar1 = &local_290.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_290.m_message._M_dataplus._M_p,
                    local_290.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1b0._0_4_ = 0x2a;
  local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
       local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p & 0xffffffff00000000;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_290,(internal *)"f()","0",local_1b0,(int *)&local_2c0,in_R9);
  if (local_290.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,local_290.m_message._M_dataplus._M_p,&local_2c9);
    local_2c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
    ;
    local_2c0.m_part_result.super_iuCodeMessage.m_line = 0x26;
    local_2c0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2c0,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_290.m_message._M_dataplus._M_p,
                    local_290.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = local_2c4.m_test_flags;
  iutest::detail::StatementsFailureCount::GetResult
            (&local_208,(StatementsFailureCount *)&local_1e0,2,
             "IUTEST_EXPECT_EQ(f(), 1); IUTEST_EXPECT_EQ(f(), 0)");
  local_1e0.super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface = (TestPartResultReporterInterface)&PTR__Collector_0013e2f0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_1e0.m_results);
  local_1e0.m_holder._vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_0013e318;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = local_1e0.m_holder.m_origin;
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,local_208.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e0);
    local_2c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
    ;
    local_2c0.m_part_result.super_iuCodeMessage.m_line = 0x26;
    local_2c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2c0,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = local_2c8.m_test_flags;
  local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x19;
  local_1b0._0_8_ = local_1a0;
  local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_2c0);
  local_1a0[0]._M_allocated_capacity =
       local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b0._0_8_ + 9) = 'o';
  *(char *)(local_1b0._0_8_ + 10) = 'u';
  *(char *)(local_1b0._0_8_ + 0xb) = 'n';
  *(char *)(local_1b0._0_8_ + 0xc) = 't';
  *(char *)(local_1b0._0_8_ + 0xd) = ' ';
  *(char *)(local_1b0._0_8_ + 0xe) = 'l';
  *(char *)(local_1b0._0_8_ + 0xf) = 'e';
  *(char *)(local_1b0._0_8_ + 0x10) = 's';
  *(char *)(local_1b0._0_8_ + 0x11) = 's';
  *(char *)(local_1b0._0_8_ + 0x12) = ' ';
  *(char *)(local_1b0._0_8_ + 0x13) = 't';
  *(char *)(local_1b0._0_8_ + 0x14) = 'h';
  *(char *)(local_1b0._0_8_ + 0x15) = 'a';
  *(char *)(local_1b0._0_8_ + 0x16) = 'n';
  *(char *)(local_1b0._0_8_ + 0x17) = ' ';
  *(char *)(local_1b0._0_8_ + 0x18) = '2';
  *(undefined8 *)local_1b0._0_8_ = 0x206572756c696166;
  *(char *)(local_1b0._0_8_ + 8) = 'c';
  *(char *)(local_1b0._0_8_ + 9) = 'o';
  *(char *)(local_1b0._0_8_ + 10) = 'u';
  *(char *)(local_1b0._0_8_ + 0xb) = 'n';
  *(char *)(local_1b0._0_8_ + 0xc) = 't';
  *(char *)(local_1b0._0_8_ + 0xd) = ' ';
  *(char *)(local_1b0._0_8_ + 0xe) = 'l';
  *(char *)(local_1b0._0_8_ + 0xf) = 'e';
  local_1b0._8_8_ = local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b0._0_8_ +
           (long)local_2c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_230,&local_268,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
  }
  local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0013e2f0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar2 = local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0013e318;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = pTVar2;
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2c0);
    local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x131131;
    local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000027;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_268,(Fixed *)local_1b0,false);
    if (local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_268.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_268.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != &local_230.m_message.field_2) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(FailureCountTest, Fail)
{
    IUTEST_EXPECT_FATAL_FAILURE(
        IUTEST_ASSERT_FAILURECOUNT_LT(IUTEST_EXPECT_EQ(f(), 1); IUTEST_EXPECT_EQ(f(), 0), 2)
        , "failure count less than 2");
}